

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O3

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  If_Cut_t *pCut;
  float fVar1;
  char cVar2;
  short sVar3;
  If_Cut_t *pC0;
  If_Cut_t *pC;
  Vec_Mem_t *pVVar4;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var5;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var6;
  bool bVar7;
  bool bVar8;
  int w;
  int iVar9;
  uint uVar10;
  int iVar11;
  If_Man_t *pIVar12;
  If_Par_t *pIVar13;
  char *pcVar14;
  ulong uVar15;
  If_Obj_t *pIVar16;
  If_Set_t *pIVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  float *pfVar24;
  ulong uVar25;
  long lVar26;
  If_Cut_t *pIVar27;
  long lVar28;
  word *pwVar29;
  uint uVar30;
  word wVar31;
  If_Cut_t *pIVar32;
  ulong *puVar33;
  int iVar34;
  Vec_Str_t *pVVar35;
  ulong uVar36;
  If_Cut_t *pIVar37;
  If_Cut_t *pIVar38;
  word *pwVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  Vec_Int_t *pVVar43;
  If_Man_t *pIVar44;
  uint uVar45;
  ulong *puVar46;
  ulong *puVar47;
  int iVar48;
  uint uVar49;
  float fVar50;
  word *pLimit;
  word *tLimit_1;
  word *tLimit;
  timespec ts;
  uint local_88c;
  long local_888;
  If_Cut_t local_838 [32];
  ulong local_438 [129];
  
  pIVar13 = p->pPars;
  local_88c = 1;
  if (((((pIVar13->fDelayOpt == 0) && (pIVar13->fDelayOptLut == 0)) && (pIVar13->fDsdBalance == 0))
      && ((pIVar13->fUserRecLib == 0 && (pIVar13->fUseDsdTune == 0)))) &&
     ((pIVar13->fUseCofVars == 0 && ((pIVar13->fUseAndVars == 0 && (pIVar13->fUse34Spec == 0)))))) {
    local_88c = (uint)(pIVar13->pLutStruct != (char *)0x0);
  }
  bVar7 = true;
  if (pIVar13->nAndDelay < 1) {
    bVar7 = 0 < pIVar13->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x68,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x69,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 0) {
    pObj->EstRefs = (float)pObj->nRefs;
    bVar8 = true;
  }
  else {
    if (Mode == 1) {
      iVar9 = pObj->nRefs;
      pObj->EstRefs = (pObj->EstRefs + pObj->EstRefs + (float)iVar9) / 3.0;
    }
    else {
      iVar9 = pObj->nRefs;
    }
    if (0 < iVar9) {
      If_CutAreaDeref(p,&pObj->CutBest);
    }
    bVar8 = false;
  }
  pIVar12 = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pCut = &pObj->CutBest;
  if (fFirst != 0) goto LAB_003adc0f;
  pIVar13 = p->pPars;
  if (pIVar13->fDelayOpt == 0) {
    if (pIVar13->fDsdBalance != 0) {
      pIVar44 = p;
      iVar9 = If_CutDsdBalanceEval(p,pCut,(Vec_Int_t *)0x0);
      iVar11 = (int)pIVar44;
      goto LAB_003adae6;
    }
    if (pIVar13->fUserRecLib != 0) {
      pIVar44 = p;
      iVar9 = If_CutDelayRecCost3(p,pCut,pObj);
      iVar11 = (int)pIVar44;
      goto LAB_003adae6;
    }
    if (pIVar13->fDelayOptLut != 0) {
      pIVar44 = p;
      iVar9 = If_CutLutBalanceEval(p,pCut);
      iVar11 = (int)pIVar44;
      goto LAB_003adae6;
    }
    if (0 < pIVar13->nGateSize) {
      pIVar44 = p;
      iVar9 = If_CutDelaySop(p,pCut);
      iVar11 = (int)pIVar44;
      goto LAB_003adae6;
    }
    pIVar44 = p;
    fVar50 = If_CutDelay(p,pObj,pCut);
    iVar11 = (int)pIVar44;
  }
  else {
    pIVar44 = p;
    iVar9 = If_CutSopBalanceEval(p,pCut,(Vec_Int_t *)0x0);
    iVar11 = (int)pIVar44;
LAB_003adae6:
    fVar50 = (float)iVar9;
  }
  (pObj->CutBest).Delay = fVar50;
  if ((fVar50 == -1.0) && (!NAN(fVar50))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x88,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar1 = p->fEpsilon;
  if (fVar1 + fVar1 + pObj->Required < fVar50) {
    Abc_Print(iVar11,
              "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n"
              ,(double)fVar50,(double)(pObj->Required + fVar1),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    fVar50 = If_CutAreaDerefed(p,pCut);
    pCut->Area = fVar50;
    pIVar13 = p->pPars;
    if (pIVar13->fEdge != 0) {
      fVar50 = If_CutEdgeDerefed(p,pCut);
      (pObj->CutBest).Edge = fVar50;
      pIVar13 = p->pPars;
    }
    if (pIVar13->fPower != 0) {
      fVar50 = If_CutPowerDerefed(p,pCut,pObj);
LAB_003adbd3:
      (pObj->CutBest).Power = fVar50;
    }
  }
  else {
    fVar50 = If_CutAreaFlow(p,pCut);
    pCut->Area = fVar50;
    pIVar13 = p->pPars;
    if (pIVar13->fEdge != 0) {
      fVar50 = If_CutEdgeFlow(p,pCut);
      (pObj->CutBest).Edge = fVar50;
      pIVar13 = p->pPars;
    }
    if (pIVar13->fPower != 0) {
      fVar50 = If_CutPowerFlow(p,pCut,pObj);
      goto LAB_003adbd3;
    }
  }
  if (fPreprocess == 0) {
    pIVar16 = pIVar12->pConst1;
    sVar3 = *(short *)((long)&pIVar12->pName + 2);
    *(short *)((long)&pIVar12->pName + 2) = sVar3 + 1;
    memcpy(*(If_Cut_t **)((long)&pIVar16->field_0x0 + (long)sVar3 * 8),pCut,(long)p->nCutBytes);
  }
LAB_003adc0f:
  pIVar16 = pObj->pFanin0;
  pIVar17 = pIVar16->pCutSet;
  if (0 < pIVar17->nCuts) {
    lVar42 = 0;
    do {
      pC0 = pIVar17->ppCuts[lVar42];
      if (pC0 == (If_Cut_t *)0x0) break;
      pIVar17 = pObj->pFanin1->pCutSet;
      if (0 < pIVar17->nCuts) {
        lVar26 = 0;
        do {
          pIVar32 = pIVar17->ppCuts[lVar26];
          if (pIVar32 == (If_Cut_t *)0x0) break;
          sVar3 = *(short *)((long)&pIVar12->pName + 2);
          if (*(short *)&pIVar12->pName < sVar3) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                          ,0x9c,
                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
          }
          uVar20 = pIVar32->uSign | pC0->uSign;
          uVar20 = (uVar20 >> 1 & 0x55555555) + (uVar20 & 0x55555555);
          uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333);
          uVar20 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
          uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
          if ((int)((uVar20 >> 0x10) + (uVar20 & 0xffff)) <= p->pPars->nLutSize) {
            pC = *(If_Cut_t **)((long)&pIVar12->pConst1->field_0x0 + (long)sVar3 * 8);
            uVar20 = *(uint *)pObj >> 4 & 1 ^ *(uint *)&pC0->field_0x1c >> 0xc & 1 ^ pC0->iCutFunc;
            uVar30 = *(uint *)pObj >> 5 & 1 ^ pIVar32->iCutFunc ^
                     *(uint *)&pIVar32->field_0x1c >> 0xc & 1;
            pIVar27 = pIVar32;
            pIVar37 = pC0;
            uVar49 = uVar30;
            if (p->pPars->fUseTtPerm == 0) {
              iVar9 = If_CutMergeOrdered(p,pC0,pIVar32,pC);
            }
            else {
              uVar10 = *(uint *)&pC0->field_0x1c >> 0x18;
              uVar21 = *(uint *)&pIVar32->field_0x1c >> 0x18;
              if ((uVar10 <= uVar21) && ((uVar10 != uVar21 || ((int)uVar20 <= (int)uVar30)))) {
                pIVar27 = pC0;
                pIVar37 = pIVar32;
                uVar49 = uVar20;
                uVar20 = uVar30;
              }
              iVar9 = If_CutMerge(p,pIVar37,pIVar27,pC);
            }
            if ((iVar9 != 0) &&
               (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize))))
            {
              p->nCutsMerged = p->nCutsMerged + 1;
              p->nCutsTotal = p->nCutsTotal + 1;
              if ((p->pPars->fSkipCutFilter != 0) ||
                 (iVar9 = If_CutFilter((If_Set_t *)pIVar12,pC,local_88c), iVar9 == 0)) {
                uVar30 = 0;
                if (((bool)((*(uint *)&pC->field_0x1c & 0xff000000) == 0x2000000 & bVar7)) &&
                   (uVar30 = 0, pC[1].Area == (float)pObj->pFanin0->Id)) {
                  uVar30 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
                }
                pC->iCutFunc = -1;
                *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar30;
                pIVar13 = p->pPars;
                if (pIVar13->fTruth != 0) {
                  if (pIVar13->fVerbose == 0) {
                    local_888 = 0;
                  }
                  else {
                    iVar9 = clock_gettime(3,(timespec *)local_838);
                    if (iVar9 < 0) {
                      local_888 = 1;
                    }
                    else {
                      lVar28 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                                      SEXT816((long)local_838[0]._8_8_),8);
                      local_888 = ((lVar28 >> 7) - (lVar28 >> 0x3f)) + local_838[0]._0_8_ * -1000000
                      ;
                    }
                    pIVar13 = p->pPars;
                  }
                  pIVar38 = pC;
                  if (pIVar13->fUseTtPerm == 0) {
                    iVar9 = If_CutComputeTruth(p,pC,pC0,pIVar32,*(uint *)pObj >> 4 & 1,
                                               *(uint *)pObj >> 5 & 1);
                  }
                  else {
                    iVar9 = If_CutComputeTruthPerm(p,pC,pIVar37,pIVar27,uVar20,uVar49);
                  }
                  pIVar13 = p->pPars;
                  if (pIVar13->fVerbose != 0) {
                    pIVar38 = local_838;
                    iVar11 = clock_gettime(3,(timespec *)pIVar38);
                    if (iVar11 < 0) {
                      lVar28 = -1;
                    }
                    else {
                      lVar28 = (long)local_838[0]._8_8_ / 1000 + local_838[0]._0_8_ * 1000000;
                    }
                    p->timeCache[4] = p->timeCache[4] + lVar28 + local_888;
                    pIVar13 = p->pPars;
                  }
                  if ((pIVar13->fSkipCutFilter == 0) && (iVar9 != 0)) {
                    pIVar38 = pC;
                    iVar9 = If_CutFilter((If_Set_t *)pIVar12,pC,local_88c);
                    if (iVar9 != 0) goto LAB_003adcdb;
                    pIVar13 = p->pPars;
                  }
                  if (pIVar13->fUseDsd == 0) {
                    uVar20 = *(uint *)&pC->field_0x1c;
                  }
                  else {
                    uVar20 = pC->iCutFunc;
                    if ((int)uVar20 < 0) goto LAB_003af41d;
                    uVar49 = uVar20 >> 1;
                    uVar40 = (ulong)(byte)pC->field_0x1f;
                    pVVar43 = p->vTtDsds[uVar40];
                    if ((int)uVar49 < pVVar43->nSize) {
                      if (pVVar43->pArray[uVar49] == -1) goto LAB_003ae0f3;
                    }
                    else {
                      do {
                        Vec_IntPush(pVVar43,(int)pIVar38);
                        uVar40 = (ulong)(byte)pC->field_0x1f;
                        uVar20 = 0;
                        do {
                          pVVar35 = p->vTtPerms[uVar40];
                          uVar30 = pVVar35->nSize;
                          if (uVar30 == pVVar35->nCap) {
                            if ((int)uVar30 < 0x10) {
                              if (pVVar35->pArray == (char *)0x0) {
                                pcVar14 = (char *)malloc(0x10);
                              }
                              else {
                                pIVar38 = (If_Cut_t *)&DAT_00000010;
                                pcVar14 = (char *)realloc(pVVar35->pArray,0x10);
                              }
                              pVVar35->pArray = pcVar14;
                              pVVar35->nCap = 0x10;
                            }
                            else {
                              pIVar32 = (If_Cut_t *)((ulong)uVar30 * 2);
                              if (pVVar35->pArray == (char *)0x0) {
                                pcVar14 = (char *)malloc((size_t)pIVar32);
                              }
                              else {
                                pIVar38 = pIVar32;
                                pcVar14 = (char *)realloc(pVVar35->pArray,(size_t)pIVar32);
                              }
                              pVVar35->pArray = pcVar14;
                              pVVar35->nCap = (int)pIVar32;
                            }
                          }
                          else {
                            pcVar14 = pVVar35->pArray;
                          }
                          iVar9 = pVVar35->nSize;
                          pVVar35->nSize = iVar9 + 1;
                          pcVar14[iVar9] = 'x';
                          uVar20 = uVar20 + 1;
                          bVar18 = pC->field_0x1f;
                          uVar40 = (ulong)bVar18;
                          uVar30 = 6;
                          if (6 < bVar18) {
                            uVar30 = (uint)bVar18;
                          }
                        } while (uVar20 < uVar30);
                        pVVar43 = p->vTtDsds[uVar40];
                      } while (pVVar43->nSize <= (int)uVar49);
                      uVar20 = pC->iCutFunc;
LAB_003ae0f3:
                      pVVar4 = p->vTtMem[uVar40];
                      if (pVVar4 == (Vec_Mem_t *)0x0) {
                        if ((int)uVar20 < 0) goto LAB_003af41d;
                        pwVar39 = (word *)0x0;
                      }
                      else {
                        if ((int)uVar20 < 0) goto LAB_003af41d;
                        uVar30 = uVar20 >> 1;
                        if (pVVar4->nEntries <= (int)uVar30) goto LAB_003af45b;
                        pwVar39 = pVVar4->ppPages[uVar30 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                  (ulong)(uVar30 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
                      }
                      uVar23 = 6;
                      if (6 < (uint)uVar40) {
                        uVar23 = uVar40;
                      }
                      uVar20 = (int)uVar23 * (uVar20 >> 1);
                      if (p->vTtPerms[uVar40]->nSize <= (int)uVar20) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                      }
                      iVar9 = If_DsdManCompute(p->pIfDsdMan,pwVar39,(uint)uVar40,
                                               (uchar *)(p->vTtPerms[uVar40]->pArray + uVar20),
                                               p->pPars->pLutStruct);
                      if (p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar49) goto LAB_003af4f6;
                      p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar49] = iVar9;
                      uVar20 = pC->iCutFunc;
                      if ((int)uVar20 < 0) goto LAB_003af43c;
                    }
                    uVar49 = p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar20 >> 1];
                    if ((int)uVar49 < 0) goto LAB_003af3fe;
                    uVar49 = uVar49 ^ uVar20 & 1;
                    pIVar38 = (If_Cut_t *)(ulong)uVar49;
                    uVar49 = If_DsdManSuppSize(p->pIfDsdMan,uVar49);
                    uVar20 = *(uint *)&pC->field_0x1c;
                    if (uVar49 != uVar20 >> 0x18) {
                      __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                    ,0xe5,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                  }
                  uVar49 = uVar20 & 0xffffbfff;
                  *(uint *)&pC->field_0x1c = uVar49;
                  pIVar13 = p->pPars;
                  p_Var5 = pIVar13->pFuncCell;
                  if (p_Var5 == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) {
                    if (pIVar13->fUseDsdTune == 0) {
                      if (pIVar13->fUse34Spec == 0) {
                        if (pIVar13->fUseAndVars != 0) {
                          if (pC->iCutFunc < 0) goto LAB_003af41d;
                          iVar9 = pIVar13->nLutSize;
                          if (0xd < iVar9) {
                            __assert_fail("p->pPars->nLutSize <= 13",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                          ,0x121,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar30 = (uint)pC->iCutFunc >> 1;
                          uVar40 = (ulong)(uVar20 >> 0x18);
                          if ((p->vTtDecs[uVar40]->nSize <= (int)uVar30) ||
                             (p->vTtDecs[uVar40]->pArray[uVar30] == -1)) {
                            pVVar43 = p->vTtDecs[uVar40];
                            if (pVVar43->nSize <= (int)uVar30) {
                              do {
                                Vec_IntPush(pVVar43,(int)pIVar38);
                                uVar49 = *(uint *)&pC->field_0x1c;
                                uVar40 = (ulong)(uVar49 >> 0x18);
                                pVVar43 = p->vTtDecs[uVar40];
                              } while (pVVar43->nSize <= (int)uVar30);
                              iVar9 = p->pPars->nLutSize;
                            }
                            iVar11 = iVar9 / 2;
                            uVar20 = 0;
                            iVar48 = (int)uVar40;
                            if ((iVar11 < iVar48) &&
                               (iVar48 <= (int)(iVar9 - (iVar9 >> 0x1f) & 0xfffffffeU))) {
                              pVVar4 = p->vTtMem[uVar40];
                              if (pVVar4 == (Vec_Mem_t *)0x0) {
                                pwVar39 = (word *)0x0;
                              }
                              else {
                                if (pC->iCutFunc < 0) goto LAB_003af41d;
                                uVar20 = (uint)pC->iCutFunc >> 1;
                                if (pVVar4->nEntries <= (int)uVar20) goto LAB_003af45b;
                                pwVar39 = pVVar4->ppPages
                                          [uVar20 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                          (ulong)(uVar20 & pVVar4->PageMask) *
                                          (long)pVVar4->nEntrySize;
                              }
                              uVar10 = 1 << ((char)uVar40 - 6U & 0x1f);
                              if (uVar49 < 0x7000000) {
                                uVar10 = 1;
                              }
                              if ((int)uVar10 < 1) {
                                uVar20 = Abc_TtProcessBiDecInt((word *)local_838,iVar48,iVar11);
                                if (uVar20 == 0) goto LAB_003aeac1;
                              }
                              else {
                                memcpy(local_838,pwVar39,(ulong)uVar10 * 8);
                                uVar20 = Abc_TtProcessBiDecInt((word *)local_838,iVar48,iVar11);
                                if (uVar20 == 0) {
                                  uVar40 = 0;
                                  do {
                                    *(word *)(&local_838[0].Area + uVar40 * 2) = ~pwVar39[uVar40];
                                    uVar40 = uVar40 + 1;
                                  } while (uVar10 != uVar40);
LAB_003aeac1:
                                  uVar49 = Abc_TtProcessBiDecInt((word *)local_838,iVar48,iVar11);
                                  uVar20 = uVar49 | 0x40000000;
                                  if (uVar49 == 0) {
                                    uVar20 = 0;
                                  }
                                }
                              }
                              uVar49 = *(uint *)&pC->field_0x1c;
                            }
                            if (p->vTtDecs[uVar49 >> 0x18]->nSize <= (int)uVar30) {
LAB_003af4f6:
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                            }
                            p->vTtDecs[uVar49 >> 0x18]->pArray[uVar30] = uVar20;
                            uVar49 = *(uint *)&pC->field_0x1c;
                          }
                          if (p->vTtDecs[uVar49 >> 0x18]->nSize <= (int)uVar30) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                          }
                          iVar9 = p->vTtDecs[uVar49 >> 0x18]->pArray[uVar30];
                          if (iVar9 < 0) {
                            __assert_fail("iDecMask >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                          ,0x12d,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar20 = 0;
                          if (iVar9 == 0) {
                            uVar20 = (uint)(p->pPars->nLutSize / 2 < (int)(uVar49 >> 0x18)) << 0xe;
                          }
                          *(uint *)&pC->field_0x1c = uVar49 & 0xffffbfff | uVar20;
                          p->nCutsUselessAll = p->nCutsUselessAll + (uVar20 >> 0xe);
                          p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                               p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                               (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                          p->nCutsCountAll = p->nCutsCountAll + 1;
                          p->nCutsCount[(byte)pC->field_0x1f] =
                               p->nCutsCount[(byte)pC->field_0x1f] + 1;
                          pIVar13 = p->pPars;
                        }
                        if ((pIVar13->fUseCofVars != 0) &&
                           ((pIVar13->fUseAndVars == 0 || ((pC->field_0x1d & 0x40) != 0)))) {
                          if (pC->iCutFunc < 0) goto LAB_003af41d;
                          uVar49 = (uint)pC->iCutFunc >> 1;
                          uVar20 = *(uint *)&pC->field_0x1c;
                          uVar40 = (ulong)(uVar20 >> 0x18);
                          pVVar35 = p->vTtVars[uVar40];
                          iVar9 = pVVar35->nSize;
                          if ((int)uVar49 < iVar9) {
                            if (pVVar35->pArray[uVar49] == -1) goto LAB_003aec8c;
                          }
                          else {
                            do {
                              if (iVar9 == pVVar35->nCap) {
                                if (iVar9 < 0x10) {
                                  if (pVVar35->pArray == (char *)0x0) {
                                    pcVar14 = (char *)malloc(0x10);
                                  }
                                  else {
                                    pcVar14 = (char *)realloc(pVVar35->pArray,0x10);
                                  }
                                  pVVar35->pArray = pcVar14;
                                  pVVar35->nCap = 0x10;
                                }
                                else {
                                  uVar20 = iVar9 * 2;
                                  if (pVVar35->pArray == (char *)0x0) {
                                    pcVar14 = (char *)malloc((ulong)uVar20);
                                  }
                                  else {
                                    pcVar14 = (char *)realloc(pVVar35->pArray,(ulong)uVar20);
                                  }
                                  pVVar35->pArray = pcVar14;
                                  pVVar35->nCap = uVar20;
                                }
                              }
                              else {
                                pcVar14 = pVVar35->pArray;
                              }
                              iVar9 = pVVar35->nSize;
                              pVVar35->nSize = iVar9 + 1;
                              pcVar14[iVar9] = -1;
                              uVar20 = *(uint *)&pC->field_0x1c;
                              uVar40 = (ulong)(uVar20 >> 0x18);
                              pVVar35 = p->vTtVars[uVar40];
                              iVar9 = pVVar35->nSize;
                            } while (iVar9 <= (int)uVar49);
LAB_003aec8c:
                            pVVar4 = p->vTtMem[uVar40];
                            if (pVVar4 == (Vec_Mem_t *)0x0) {
                              puVar46 = (ulong *)0x0;
                            }
                            else {
                              if (pC->iCutFunc < 0) {
LAB_003af41d:
                                __assert_fail("Lit >= 0",
                                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                              ,0xf2,"int Abc_Lit2Var(int)");
                              }
                              uVar30 = (uint)pC->iCutFunc >> 1;
                              if (pVVar4->nEntries <= (int)uVar30) {
LAB_003af45b:
                                __assert_fail("i >= 0 && i < p->nEntries",
                                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                              }
                              puVar46 = pVVar4->ppPages[uVar30 >> ((byte)pVVar4->LogPageSze & 0x1f)]
                                        + (ulong)(uVar30 & pVVar4->PageMask) *
                                          (long)pVVar4->nEntrySize;
                            }
                            uVar10 = 1 << ((char)uVar40 - 6U & 0x1f);
                            uVar30 = uVar10;
                            if (uVar20 < 0x7000000) {
                              uVar30 = 1;
                            }
                            if (0xdffffff < uVar20) {
                              __assert_fail("nVars <= nVarsMax",
                                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                                            ,0x46b,"int Abc_TtCheckCondDep(word *, int, int)");
                            }
                            uVar23 = 0;
                            if (0xffffff < uVar20) {
                              iVar9 = p->pPars->nLutSize / 2;
                              if (iVar9 + 1 < (int)uVar40) {
                                uVar21 = uVar10;
                                if ((int)uVar10 < 2) {
                                  uVar21 = 1;
                                }
                                uVar15 = 0;
LAB_003aed7e:
                                uVar23 = uVar15;
                                bVar18 = (byte)uVar23;
                                if (uVar30 == 1) {
                                  uVar41 = s_Truths6Neg[uVar23] & *puVar46;
                                  bVar18 = (byte)(1 << (bVar18 & 0x1f));
                                  uVar15 = *puVar46 & s_Truths6[uVar23];
                                  uVar41 = uVar41 << (bVar18 & 0x3f) | uVar41;
                                  local_838[0].Area = (float)(int)uVar41;
                                  local_838[0].Edge = (float)(int)(uVar41 >> 0x20);
                                  local_438[0] = uVar15 >> (bVar18 & 0x3f) | uVar15;
                                }
                                else {
                                  if (uVar23 < 6) {
                                    if ((int)uVar30 < 1) goto LAB_003aedd7;
                                    uVar15 = s_Truths6Neg[uVar23];
                                    uVar41 = 0;
                                    do {
                                      *(ulong *)(&local_838[0].Area + uVar41 * 2) =
                                           (puVar46[uVar41] & uVar15) <<
                                           ((byte)(1 << (bVar18 & 0x1f)) & 0x3f) |
                                           puVar46[uVar41] & uVar15;
                                      uVar41 = uVar41 + 1;
                                    } while (uVar30 != uVar41);
                                  }
                                  else {
                                    if ((int)uVar30 < 1) goto LAB_003aedd7;
                                    bVar19 = (byte)(uVar23 - 6);
                                    uVar45 = 1 << (bVar19 & 0x1f);
                                    lVar28 = (long)(2 << (bVar19 & 0x1f));
                                    uVar15 = 1;
                                    if (1 < (int)uVar45) {
                                      uVar15 = (ulong)uVar45;
                                    }
                                    pfVar24 = &local_838[0].Area + (long)(int)uVar45 * 2;
                                    pIVar32 = local_838;
                                    puVar33 = puVar46;
                                    do {
                                      if (uVar23 - 6 != 0x1f) {
                                        uVar41 = 0;
                                        do {
                                          uVar25 = puVar33[uVar41];
                                          *(ulong *)(&pIVar32->Area + uVar41 * 2) = uVar25;
                                          *(ulong *)(pfVar24 + uVar41 * 2) = uVar25;
                                          uVar41 = uVar41 + 1;
                                        } while (uVar15 != uVar41);
                                      }
                                      puVar33 = puVar33 + lVar28;
                                      pfVar24 = pfVar24 + lVar28 * 2;
                                      pIVar32 = (If_Cut_t *)(&pIVar32->Area + lVar28 * 2);
                                    } while (puVar33 < puVar46 + (int)uVar30);
                                  }
                                  if (uVar23 < 6) {
                                    if (0 < (int)uVar30) {
                                      uVar15 = s_Truths6[uVar23];
                                      uVar41 = 0;
                                      do {
                                        local_438[uVar41] =
                                             (puVar46[uVar41] & uVar15) >>
                                             ((byte)(1 << (bVar18 & 0x1f)) & 0x3f) |
                                             puVar46[uVar41] & uVar15;
                                        uVar41 = uVar41 + 1;
                                      } while (uVar30 != uVar41);
                                    }
                                  }
                                  else if (0 < (int)uVar30) {
                                    bVar18 = (byte)(uVar23 - 6);
                                    uVar45 = 1 << (bVar18 & 0x1f);
                                    iVar11 = 2 << (bVar18 & 0x1f);
                                    uVar15 = 1;
                                    if (1 < (int)uVar45) {
                                      uVar15 = (ulong)uVar45;
                                    }
                                    puVar33 = local_438;
                                    puVar47 = puVar46;
                                    do {
                                      if (uVar23 - 6 != 0x1f) {
                                        uVar41 = 0;
                                        do {
                                          uVar25 = puVar47[(long)(int)uVar45 + uVar41];
                                          puVar33[uVar41] = uVar25;
                                          puVar33[(long)(int)uVar45 + uVar41] = uVar25;
                                          uVar41 = uVar41 + 1;
                                        } while (uVar15 != uVar41);
                                      }
                                      puVar47 = puVar47 + iVar11;
                                      puVar33 = puVar33 + iVar11;
                                    } while (puVar47 < puVar46 + (int)uVar30);
                                  }
                                }
LAB_003aedd7:
                                uVar15 = 0;
                                iVar48 = 0;
                                iVar11 = 0;
LAB_003aee01:
                                if (uVar23 != uVar15) {
                                  bVar18 = (byte)uVar15;
                                  if (0x6ffffff < uVar20) {
                                    if (uVar15 < 6) {
                                      uVar41 = 0;
                                      do {
                                        if (((*(ulong *)(&local_838[0].Area + uVar41 * 2) >>
                                              ((byte)(1 << (bVar18 & 0x1f)) & 0x3f) ^
                                             *(ulong *)(&local_838[0].Area + uVar41 * 2)) &
                                            s_Truths6Neg[uVar15]) != 0) goto LAB_003aeefa;
                                        uVar41 = uVar41 + 1;
                                      } while (uVar21 != uVar41);
                                      iVar34 = 0;
                                    }
                                    else {
                                      uVar41 = (ulong)(uint)(1 << (bVar18 - 6 & 0x1f));
                                      uVar25 = (ulong)(uint)(2 << (bVar18 - 6 & 0x1f));
                                      pfVar24 = &local_838[0].Area + uVar41 * 2;
                                      pIVar32 = local_838;
                                      do {
                                        uVar36 = 0;
                                        do {
                                          if (*(long *)(&pIVar32->Area + uVar36 * 2) !=
                                              *(long *)(pfVar24 + uVar36 * 2)) goto LAB_003aeefa;
                                          uVar36 = uVar36 + 1;
                                        } while (uVar41 != uVar36);
                                        pIVar32 = (If_Cut_t *)(&pIVar32->Area + uVar25 * 2);
                                        pfVar24 = pfVar24 + uVar25 * 2;
                                        iVar34 = 0;
                                      } while (pIVar32 < (If_Cut_t *)
                                                         (&local_838[0].Area + (long)(int)uVar10 * 2
                                                         ));
                                    }
                                    goto LAB_003aeeff;
                                  }
                                  bVar18 = (byte)(1 << (bVar18 & 0x1f));
                                  iVar11 = (iVar11 + 1) -
                                           (uint)((((ulong)local_838[0]._0_8_ >> (bVar18 & 0x3f) ^
                                                   local_838[0]._0_8_) & s_Truths6Neg[uVar15]) == 0)
                                  ;
                                  uVar22 = (uint)((s_Truths6Neg[uVar15] &
                                                  (local_438[0] >> (bVar18 & 0x3f) ^ local_438[0]))
                                                 != 0);
                                  goto LAB_003aef9b;
                                }
                                goto LAB_003aefab;
                              }
                            }
LAB_003af1ae:
                            if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar49) {
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)")
                              ;
                            }
                            p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar49] = (char)uVar23;
                            uVar20 = *(uint *)&pC->field_0x1c;
                            uVar40 = (ulong)(uVar20 >> 0x18);
                          }
                          if (p->vTtVars[uVar40]->nSize <= (int)uVar49) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                          }
                          cVar2 = p->vTtVars[uVar40]->pArray[uVar49];
                          if ((cVar2 < '\0') || ((int)uVar40 < (int)cVar2)) {
                            __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                          ,0x13f,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar49 = (uint)(0xffffff < uVar20 && (int)uVar40 == (int)cVar2);
                          *(uint *)&pC->field_0x1c = uVar20 & 0xffffbfff | uVar49 << 0xe;
                          p->nCutsUselessAll = p->nCutsUselessAll + uVar49;
                          p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                               p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                               (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                          p->nCutsCountAll = p->nCutsCountAll + 1;
                          p->nCutsCount[(byte)pC->field_0x1f] =
                               p->nCutsCount[(byte)pC->field_0x1f] + 1;
                        }
                      }
                      else {
                        if (0x4ffffff < uVar20) {
                          __assert_fail("pCut->nLeaves <= 4",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                        ,0x118,
                                        "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                       );
                        }
                        if ((uVar20 & 0x7000000) == 0x4000000) {
                          uVar20 = pC->iCutFunc;
                          if ((int)uVar20 < 0) goto LAB_003af47a;
                          pwVar39 = p->puTempW;
                          pVVar4 = p->vTtMem[4];
                          if (pVVar4 == (Vec_Mem_t *)0x0) {
                            pwVar29 = (word *)0x0;
                          }
                          else {
                            uVar49 = uVar20 >> 1;
                            if (pVVar4->nEntries <= (int)uVar49) goto LAB_003af45b;
                            pwVar29 = pVVar4->ppPages[uVar49 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                      (ulong)(uVar49 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
                          }
                          uVar49 = p->nTruth6Words[4];
                          if ((uVar20 & 1) == 0) {
                            if (0 < (int)uVar49) {
                              uVar40 = 0;
                              do {
                                pwVar39[uVar40] = pwVar29[uVar40];
                                uVar40 = uVar40 + 1;
                              } while (uVar49 != uVar40);
                            }
                          }
                          else if (0 < (int)uVar49) {
                            uVar40 = 0;
                            do {
                              pwVar39[uVar40] = ~pwVar29[uVar40];
                              uVar40 = uVar40 + 1;
                            } while (uVar49 != uVar40);
                          }
                          uVar20 = (uint)*pwVar39;
                          uVar49 = uVar20 & 0xffff;
                          if ((((((uVar49 & uVar49 - 1) != 0) && ((uVar20 & 0xffff) != 0x6996)) &&
                               ((uVar20 & 0xffff) != 0x9669)) &&
                              (((uVar49 ^ 0xffff) & 0xfffe - uVar49) != 0)) &&
                             (((uVar20 = (uVar20 >> 1 & 0x5555) + (uVar20 & 0x5555),
                               uVar20 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333),
                               uVar20 = (uVar20 >> 4 & 0x707) + (uVar20 & 0x707),
                               iVar9 = (uVar20 >> 8) + (uVar20 & 0xff), uVar20 = uVar49 ^ 0xffff,
                               iVar9 != 9 && (uVar20 = uVar49, iVar9 != 7)) ||
                              (iVar9 = Abc_Tt4CheckTwoLevel(uVar20), iVar9 < 1)))) {
                            pC->field_0x1d = pC->field_0x1d | 0x40;
                          }
                        }
                      }
                    }
                    else {
                      uVar49 = pC->iCutFunc;
                      if ((int)uVar49 < 0) {
LAB_003af43c:
                        __assert_fail("pCut->iCutFunc >= 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                                      ,0x1a7,"int If_CutTruthLit(If_Cut_t *)");
                      }
                      uVar20 = p->vTtDsds[uVar20 >> 0x18]->pArray[uVar49 >> 1];
                      if ((int)uVar20 < 0) {
LAB_003af3fe:
                        __assert_fail("Lit >= 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                      ,0xf5,"int Abc_LitNotCond(int, int)");
                      }
                      uVar20 = If_DsdManReadMark(p->pIfDsdMan,uVar20 ^ uVar49 & 1);
                      *(uint *)&pC->field_0x1c =
                           *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar20 & 1) << 0xe;
                      p->nCutsUselessAll = p->nCutsUselessAll + (uVar20 & 1);
                      p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                           p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                           (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                      p->nCutsCountAll = p->nCutsCountAll + 1;
                      p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                    }
                  }
                  else {
                    if (pIVar13->fUseTtPerm != 0) {
                      __assert_fail("p->pPars->fUseTtPerm == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                    ,0xec,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (0xc < (uVar20 >> 0x10 & 0xff) - 4) {
                      __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                                    ,0xed,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (pIVar13->fUseDsd == 0) {
                      uVar49 = pC->iCutFunc;
                      if ((int)uVar49 < 0) goto LAB_003af47a;
                      pwVar39 = p->puTempW;
                      pVVar4 = p->vTtMem[uVar20 >> 0x18];
                      if (pVVar4 == (Vec_Mem_t *)0x0) {
                        pwVar29 = (word *)0x0;
                      }
                      else {
                        uVar30 = uVar49 >> 1;
                        if (pVVar4->nEntries <= (int)uVar30) goto LAB_003af45b;
                        pwVar29 = pVVar4->ppPages[uVar30 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                  (ulong)(uVar30 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
                      }
                      uVar20 = p->nTruth6Words[uVar20 >> 0x18];
                      if ((uVar49 & 1) == 0) {
                        if (0 < (int)uVar20) {
                          uVar40 = 0;
                          do {
                            pwVar39[uVar40] = pwVar29[uVar40];
                            uVar40 = uVar40 + 1;
                          } while (uVar20 != uVar40);
                        }
                      }
                      else if (0 < (int)uVar20) {
                        uVar40 = 0;
                        do {
                          pwVar39[uVar40] = ~pwVar29[uVar40];
                          uVar40 = uVar40 + 1;
                        } while (uVar20 != uVar40);
                      }
                      uVar49 = *(uint *)&pC->field_0x1c >> 0x18;
                      uVar20 = 6;
                      if (6 < uVar49) {
                        uVar20 = uVar49;
                      }
                      iVar9 = (*p_Var5)(p,(uint *)pwVar39,uVar20,uVar49,pIVar13->pLutStruct);
                      uVar20 = (uint)(iVar9 == 0);
                    }
                    else {
                      uVar49 = pC->iCutFunc;
                      if ((int)uVar49 < 0) goto LAB_003af43c;
                      uVar20 = p->vTtDsds[uVar20 >> 0x18]->pArray[uVar49 >> 1];
                      if ((int)uVar20 < 0) goto LAB_003af3fe;
                      uVar20 = If_DsdManCheckDec(p->pIfDsdMan,uVar20 ^ uVar49 & 1);
                      uVar20 = uVar20 & 1;
                    }
                    *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar20 << 0xe
                    ;
                    p->nCutsUselessAll = p->nCutsUselessAll + uVar20;
                    p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                         p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                         (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                    p->nCutsCountAll = p->nCutsCountAll + 1;
                    p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                    pIVar13 = p->pPars;
                    if (((pIVar13->fEnableCheck75 == 0) && (pIVar13->fEnableCheck75u == 0)) ||
                       (*(short *)&pC->field_0x1e != 0x505)) {
                      if ((pIVar13->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                        uVar20 = pC->iCutFunc;
                        if ((int)uVar20 < 0) goto LAB_003af47a;
                        pwVar39 = p->puTempW;
                        pVVar4 = p->vTtMem[5];
                        if (pVVar4 == (Vec_Mem_t *)0x0) {
                          pwVar29 = (word *)0x0;
                        }
                        else {
                          uVar49 = uVar20 >> 1;
                          if (pVVar4->nEntries <= (int)uVar49) goto LAB_003af45b;
                          pwVar29 = pVVar4->ppPages[uVar49 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                    (ulong)(uVar49 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
                        }
                        uVar49 = p->nTruth6Words[5];
                        if ((uVar20 & 1) == 0) {
                          if (0 < (int)uVar49) {
                            uVar40 = 0;
                            do {
                              pwVar39[uVar40] = pwVar29[uVar40];
                              uVar40 = uVar40 + 1;
                            } while (uVar49 != uVar40);
                          }
                        }
                        else if (0 < (int)uVar49) {
                          uVar40 = 0;
                          do {
                            pwVar39[uVar40] = ~pwVar29[uVar40];
                            uVar40 = uVar40 + 1;
                          } while (uVar49 != uVar40);
                        }
                        wVar31 = CONCAT44((int)*pwVar39,(int)*pwVar39);
                        p->nCuts5 = p->nCuts5 + 1;
                        iVar9 = If_CluCheckDecInAny(wVar31,5);
                        if ((iVar9 != 0) || (iVar9 = If_CluCheckDecOut(wVar31,5), iVar9 != 0))
                        goto LAB_003ae76f;
                      }
                    }
                    else {
                      uVar20 = pC->iCutFunc;
                      if ((int)uVar20 < 0) {
LAB_003af47a:
                        __assert_fail("pCut->iCutFunc >= 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                                      ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
                      }
                      pwVar39 = p->puTempW;
                      pVVar4 = p->vTtMem[5];
                      if (pVVar4 == (Vec_Mem_t *)0x0) {
                        pwVar29 = (word *)0x0;
                      }
                      else {
                        uVar49 = uVar20 >> 1;
                        if (pVVar4->nEntries <= (int)uVar49) goto LAB_003af45b;
                        pwVar29 = pVVar4->ppPages[uVar49 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                                  (ulong)(uVar49 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
                      }
                      uVar49 = p->nTruth6Words[5];
                      if ((uVar20 & 1) == 0) {
                        if (0 < (int)uVar49) {
                          uVar40 = 0;
                          do {
                            pwVar39[uVar40] = pwVar29[uVar40];
                            uVar40 = uVar40 + 1;
                          } while (uVar49 != uVar40);
                        }
                      }
                      else if (0 < (int)uVar49) {
                        uVar40 = 0;
                        do {
                          pwVar39[uVar40] = ~pwVar29[uVar40];
                          uVar40 = uVar40 + 1;
                        } while (uVar49 != uVar40);
                      }
                      wVar31 = *pwVar39;
                      p->nCuts5 = p->nCuts5 + 1;
                      iVar9 = If_CluCheckDecInAny(CONCAT44((int)wVar31,(int)wVar31),5);
                      if (iVar9 == 0) goto LAB_003adcdb;
LAB_003ae76f:
                      p->nCuts5a = p->nCuts5a + 1;
                    }
                  }
                }
                uVar49 = (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0)
                         << 0xd;
                uVar20 = *(uint *)&pC->field_0x1c;
                *(uint *)&pC->field_0x1c = uVar20 & 0xffffdfff | uVar49;
                p_Var6 = p->pPars->pFuncCost;
                if (p_Var6 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
                  *(uint *)&pC->field_0x1c = uVar20 & 0xffffd000 | uVar49;
                }
                else {
                  uVar20 = (*p_Var6)(p,pC);
                  *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xfffff000 | uVar20 & 0xfff;
                  if ((uVar20 & 0xfff) == 0xfff) goto LAB_003adcdb;
                }
                pIVar13 = p->pPars;
                if (pIVar13->fDelayOpt == 0) {
                  if (pIVar13->fDsdBalance != 0) {
                    iVar9 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                    goto LAB_003ae854;
                  }
                  if (pIVar13->fUserRecLib != 0) {
                    iVar9 = If_CutDelayRecCost3(p,pC,pObj);
                    goto LAB_003ae854;
                  }
                  if (pIVar13->fDelayOptLut != 0) {
                    iVar9 = If_CutLutBalanceEval(p,pC);
                    goto LAB_003ae854;
                  }
                  if (0 < pIVar13->nGateSize) {
                    iVar9 = If_CutDelaySop(p,pC);
                    goto LAB_003ae854;
                  }
                  fVar50 = If_CutDelay(p,pObj,pC);
                }
                else {
                  iVar9 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_003ae854:
                  fVar50 = (float)iVar9;
                }
                pC->Delay = fVar50;
                if (((fVar50 != -1.0) || (NAN(fVar50))) &&
                   ((bVar8 || (fVar50 <= pObj->Required + p->fEpsilon)))) {
                  if (Mode == 2) {
                    fVar50 = If_CutAreaDerefed(p,pC);
                    pC->Area = fVar50;
                    pIVar13 = p->pPars;
                    if (pIVar13->fEdge != 0) {
                      fVar50 = If_CutEdgeDerefed(p,pC);
                      pC->Edge = fVar50;
                      pIVar13 = p->pPars;
                    }
                    if (pIVar13->fPower != 0) {
                      fVar50 = If_CutPowerDerefed(p,pC,pObj);
LAB_003ae924:
                      pC->Power = fVar50;
                    }
                  }
                  else {
                    fVar50 = If_CutAreaFlow(p,pC);
                    pC->Area = fVar50;
                    pIVar13 = p->pPars;
                    if (pIVar13->fEdge != 0) {
                      fVar50 = If_CutEdgeFlow(p,pC);
                      pC->Edge = fVar50;
                      pIVar13 = p->pPars;
                    }
                    if (pIVar13->fPower != 0) {
                      fVar50 = If_CutPowerFlow(p,pC,pObj);
                      goto LAB_003ae924;
                    }
                  }
                  If_CutSort(p,(If_Set_t *)pIVar12,pC);
                }
              }
            }
          }
LAB_003adcdb:
          lVar26 = lVar26 + 1;
          pIVar17 = pObj->pFanin1->pCutSet;
        } while (lVar26 < pIVar17->nCuts);
        pIVar16 = pObj->pFanin0;
      }
      lVar42 = lVar42 + 1;
      pIVar17 = pIVar16->pCutSet;
    } while (lVar42 < pIVar17->nCuts);
  }
  if (*(short *)((long)&pIVar12->pName + 2) < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x176,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((fPreprocess == 0) ||
       ((*(If_Cut_t **)pIVar12->pConst1)->Delay <= pObj->Required + p->fEpsilon)) &&
      (memcpy(pCut,*(If_Cut_t **)pIVar12->pConst1,(long)p->nCutBytes), p->pPars->fUserRecLib != 0))
     && (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
         (pfVar24 = &(pObj->CutBest).Delay, 1e+09 < *pfVar24 || *pfVar24 == 1e+09)))) {
    __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                  ,0x17e,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  pIVar44 = pIVar12;
  if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
    pIVar16 = pIVar12->pConst1;
    sVar3 = *(short *)((long)&pIVar12->pName + 2);
    *(short *)((long)&pIVar12->pName + 2) = sVar3 + 1;
    pIVar44 = p;
    If_ManSetupCutTriv(p,*(If_Cut_t **)((long)&pIVar16->field_0x0 + (long)sVar3 * 8),pObj->Id);
    if (*(short *)&pIVar12->pName + 1 < (int)*(short *)((long)&pIVar12->pName + 2)) {
      __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifMap.c"
                    ,0x184,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  iVar9 = (int)pIVar44;
  if ((!bVar8) && (0 < pObj->nRefs)) {
    pIVar12 = p;
    If_CutAreaRef(p,pCut);
    iVar9 = (int)pIVar12;
  }
  if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
    Abc_Print(iVar9,"The best cut is useless.\n");
  }
  if ((p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) &&
     (pIVar17 = pObj->pCutSet, 0 < pIVar17->nCuts)) {
    lVar42 = 0;
    do {
      if (pIVar17->ppCuts[lVar42] == (If_Cut_t *)0x0) break;
      (*p->pPars->pFuncUser)(p,pObj,pIVar17->ppCuts[lVar42]);
      lVar42 = lVar42 + 1;
      pIVar17 = pObj->pCutSet;
    } while (lVar42 < pIVar17->nCuts);
  }
  If_ManDerefNodeCutSet(p,pObj);
  return;
LAB_003aeefa:
  iVar34 = 1;
LAB_003aeeff:
  iVar11 = iVar34 + iVar11;
  if (uVar15 < 6) {
    uVar41 = 0;
    do {
      if (((local_438[uVar41] >> ((byte)(1 << (bVar18 & 0x1f)) & 0x3f) ^ local_438[uVar41]) &
          s_Truths6Neg[uVar15]) != 0) goto LAB_003aef91;
      uVar41 = uVar41 + 1;
    } while (uVar21 != uVar41);
    uVar22 = 0;
  }
  else {
    uVar41 = (ulong)(uint)(1 << (bVar18 - 6 & 0x1f));
    uVar45 = 2 << (bVar18 - 6 & 0x1f);
    puVar47 = local_438 + uVar41;
    puVar33 = local_438;
    do {
      uVar25 = 0;
      do {
        if (puVar33[uVar25] != puVar47[uVar25]) goto LAB_003aef91;
        uVar25 = uVar25 + 1;
      } while (uVar41 != uVar25);
      puVar33 = puVar33 + uVar45;
      puVar47 = puVar47 + uVar45;
      uVar22 = 0;
    } while (puVar33 < local_438 + (int)uVar10);
  }
LAB_003aef9b:
  if ((iVar9 < iVar11) || (iVar48 = iVar48 + uVar22, iVar9 < iVar48)) goto LAB_003af015;
LAB_003aefab:
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar40) goto LAB_003af1ae;
  goto LAB_003aee01;
LAB_003aef91:
  uVar22 = 1;
  goto LAB_003aef9b;
LAB_003af015:
  if (((int)uVar40 == (int)uVar15) || (uVar15 = uVar23 + 1, uVar23 = uVar40, uVar15 == uVar40))
  goto LAB_003af1ae;
  goto LAB_003aed7e;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct != NULL;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
        {
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDsdBalance )
        {
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fUserRecLib )
        {
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if(p->pPars->fUserRecLib)
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}